

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_array_fill(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val;
  JSValue val_00;
  JSValue val_01;
  JSValue this_obj;
  JSValue JVar1;
  int iVar2;
  int in_ECX;
  JSContext *in_RDI;
  JSValue *in_R8;
  JSValue JVar3;
  JSValue JVar4;
  JSContext *unaff_retaddr;
  JSValue in_stack_00000008;
  int64_t end;
  int64_t start;
  int64_t len;
  JSValue obj;
  JSContext *in_stack_ffffffffffffff70;
  JSValueUnion in_stack_ffffffffffffff78;
  JSValueUnion in_stack_ffffffffffffff80;
  int64_t *in_stack_ffffffffffffff88;
  JSValueUnion ctx_00;
  JSValueUnion pres;
  JSContext *in_stack_ffffffffffffffa0;
  JSValueUnion JVar5;
  JSContext *in_stack_ffffffffffffffb0;
  JSContext *pJVar6;
  undefined4 local_10;
  undefined4 uStack_c;
  JSValueUnion local_8;
  
  JVar3 = JS_ToObject(unaff_retaddr,in_stack_00000008);
  ctx_00 = JVar3.u;
  pres = (JSValueUnion)JVar3.tag;
  JVar4.tag = (int64_t)in_stack_ffffffffffffffa0;
  JVar4.u = (int32_t)pres.ptr;
  local_8 = pres;
  iVar2 = js_get_length64((JSContext *)ctx_00.ptr,in_stack_ffffffffffffff88,JVar4);
  if (((iVar2 == 0) &&
      (((JVar5.float64 = 0.0, in_ECX < 2 || (iVar2 = JS_IsUndefined(in_R8[1]), iVar2 != 0)) ||
       (val_00.tag = (int64_t)in_stack_ffffffffffffffb0, val_00.u.ptr = JVar5.ptr,
       iVar2 = JS_ToInt64Clamp(in_stack_ffffffffffffffa0,(int64_t *)pres.ptr,val_00,(int64_t)ctx_00,
                               (int64_t)in_stack_ffffffffffffff88,(int64_t)local_8), iVar2 == 0))))
     && (((pJVar6 = in_stack_ffffffffffffffb0, in_ECX < 3 ||
          (iVar2 = JS_IsUndefined(in_R8[2]), iVar2 != 0)) ||
         (val_01.tag = (int64_t)pJVar6, val_01.u.ptr = JVar5.ptr,
         iVar2 = JS_ToInt64Clamp(in_stack_ffffffffffffffb0,(int64_t *)pres.ptr,val_01,
                                 (int64_t)ctx_00,(int64_t)in_stack_ffffffffffffff88,(int64_t)local_8
                                ), iVar2 == 0)))) {
    for (; in_stack_ffffffffffffff78 = JVar5,
        (long)in_stack_ffffffffffffff78.ptr < (long)in_stack_ffffffffffffffb0;
        JVar5.float64 = JVar5.float64 + 1) {
      in_stack_ffffffffffffff70 = in_RDI;
      JVar5 = in_stack_ffffffffffffff78;
      JVar4 = JS_DupValue(in_RDI,*in_R8);
      in_stack_ffffffffffffff80 = JVar4.u;
      this_obj.tag = (int64_t)pJVar6;
      this_obj.u.ptr = JVar5.ptr;
      val.tag = (int64_t)in_stack_ffffffffffffffb0;
      val.u.float64 = pres.float64;
      iVar2 = JS_SetPropertyInt64((JSContext *)ctx_00.ptr,this_obj,JVar4.tag,val);
      if (iVar2 < 0) goto LAB_001afa83;
    }
    local_10 = JVar3.u._0_4_;
    uStack_c = JVar3.u._4_4_;
  }
  else {
LAB_001afa83:
    JVar3.tag = (int64_t)in_stack_ffffffffffffff80.ptr;
    JVar3.u.float64 = in_stack_ffffffffffffff78.float64;
    JS_FreeValue(in_stack_ffffffffffffff70,JVar3);
    local_10 = 0;
    local_8.float64 = 2.96439387504748e-323;
  }
  JVar1.u._4_4_ = uStack_c;
  JVar1.u.int32 = local_10;
  JVar1.tag = (int64_t)local_8.ptr;
  return JVar1;
}

Assistant:

static JSValue js_array_fill(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv)
{
    JSValue obj;
    int64_t len, start, end;

    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &len, obj))
        goto exception;

    start = 0;
    if (argc > 1 && !JS_IsUndefined(argv[1])) {
        if (JS_ToInt64Clamp(ctx, &start, argv[1], 0, len, len))
            goto exception;
    }

    end = len;
    if (argc > 2 && !JS_IsUndefined(argv[2])) {
        if (JS_ToInt64Clamp(ctx, &end, argv[2], 0, len, len))
            goto exception;
    }

    /* XXX: should special case fast arrays */
    while (start < end) {
        if (JS_SetPropertyInt64(ctx, obj, start,
                                JS_DupValue(ctx, argv[0])) < 0)
            goto exception;
        start++;
    }
    return obj;

 exception:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}